

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matd.c
# Opt level: O3

matd_plu_t * matd_plu(matd_t *a)

{
  matd_t mVar1;
  undefined1 auVar2 [16];
  undefined1 *__src;
  matd_t *pmVar3;
  uint *puVar4;
  uint uVar5;
  ulong uVar6;
  undefined1 *__dest;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  uint uVar12;
  ulong uVar13;
  matd_t *pmVar14;
  size_t __n;
  int iVar15;
  uint uVar16;
  double dVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar21 [16];
  undefined1 auStack_88 [8];
  ulong local_80;
  ulong local_78;
  undefined1 *local_70;
  undefined1 *local_68;
  matd_t *local_60;
  matd_t *local_58;
  uint *local_50;
  matd_plu_t *local_48;
  int local_3c;
  matd_t *local_38;
  long lVar20;
  
  puVar4 = (uint *)calloc((ulong)a->nrows,4);
  local_38 = matd_copy(a);
  uVar10 = (ulong)a->nrows;
  if (a->nrows != a->ncols) {
    __assert_fail("a->nrows == a->ncols",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/matd.c"
                  ,0x5df,"matd_plu_t *matd_plu(const matd_t *)");
  }
  local_48 = (matd_plu_t *)calloc(1,0x20);
  pmVar3 = local_38;
  auVar2 = _DAT_003d60b0;
  local_3c = 1;
  pmVar14 = local_38;
  local_50 = puVar4;
  if (uVar10 != 0) {
    lVar20 = uVar10 - 1;
    auVar18._8_4_ = (int)lVar20;
    auVar18._0_8_ = lVar20;
    auVar18._12_4_ = (int)((ulong)lVar20 >> 0x20);
    uVar6 = 0;
    auVar18 = auVar18 ^ _DAT_003d60b0;
    auVar19 = _DAT_003d60a0;
    do {
      auVar21 = auVar19 ^ auVar2;
      if ((bool)(~(auVar21._4_4_ == auVar18._4_4_ && auVar18._0_4_ < auVar21._0_4_ ||
                  auVar18._4_4_ < auVar21._4_4_) & 1)) {
        puVar4[uVar6] = (uint)uVar6;
      }
      if ((auVar21._12_4_ != auVar18._12_4_ || auVar21._8_4_ <= auVar18._8_4_) &&
          auVar21._12_4_ <= auVar18._12_4_) {
        puVar4[uVar6 + 1] = (uint)uVar6 + 1;
      }
      uVar6 = uVar6 + 2;
      lVar20 = auVar19._8_8_;
      auVar19._0_8_ = auVar19._0_8_ + 2;
      auVar19._8_8_ = lVar20 + 2;
    } while ((uVar10 + 1 & 0xfffffffffffffffe) != uVar6);
    if (uVar10 != 0) {
      uVar9 = local_38->ncols;
      local_3c = 1;
      local_80 = 1;
      local_70 = auStack_88;
      uVar10 = 0;
      local_58 = a;
      do {
        uVar5 = a->nrows;
        uVar16 = (uint)uVar10;
        if ((ulong)uVar5 != 0) {
          uVar6 = 0;
          uVar8 = 0;
          do {
            uVar11 = uVar8;
            if (uVar10 < uVar8) {
              uVar11 = uVar10;
            }
            uVar7 = (uint)uVar8;
            uVar12 = uVar7;
            if (uVar16 < uVar7) {
              uVar12 = uVar16;
            }
            dVar17 = 0.0;
            iVar15 = (int)uVar6;
            if (uVar12 != 0) {
              uVar13 = uVar10 & 0xffffffff;
              do {
                dVar17 = dVar17 + (double)pmVar3[uVar6 + 1] * (double)pmVar3[uVar13 + 1];
                uVar13 = (ulong)((int)uVar13 + uVar9);
                uVar6 = (ulong)((int)uVar6 + 1);
                uVar11 = uVar11 - 1;
              } while (uVar11 != 0);
            }
            uVar6 = (ulong)(uVar9 * uVar7 + uVar16);
            pmVar3[uVar6 + 1] = (matd_t)((double)pmVar3[uVar6 + 1] - dVar17);
            uVar8 = uVar8 + 1;
            uVar6 = (ulong)(iVar15 + uVar9);
          } while (uVar8 != uVar5);
        }
        local_78 = uVar10 + 1;
        uVar6 = uVar10 & 0xffffffff;
        if (local_78 < pmVar14->nrows) {
          uVar5 = uVar9 * (int)local_80 + uVar16;
          uVar6 = uVar10 & 0xffffffff;
          uVar8 = local_80;
          do {
            uVar11 = uVar8 & 0xffffffff;
            if (ABS((double)pmVar3[(ulong)uVar5 + 1]) <=
                ABS((double)pmVar3[(ulong)(uVar9 * (int)uVar6 + uVar16) + 1])) {
              uVar11 = uVar6;
            }
            uVar6 = uVar11;
            uVar8 = uVar8 + 1;
            uVar5 = uVar5 + uVar9;
          } while (pmVar14->nrows != uVar8);
        }
        iVar15 = (int)uVar6;
        if (uVar10 != uVar6) {
          __dest = local_70 + -((ulong)uVar9 * 8 + 0xf & 0xfffffffffffffff0);
          __n = (ulong)uVar9 << 3;
          local_68 = __dest;
          local_60 = pmVar3 + (ulong)(uVar9 * iVar15) + 1;
          *(undefined8 *)(__dest + -8) = 0x3cbcc1;
          memcpy(__dest,pmVar3 + (ulong)(uVar9 * iVar15) + 1,__n);
          a = local_58;
          pmVar14 = local_60;
          *(undefined8 *)(__dest + -8) = 0x3cbcd9;
          memcpy(pmVar14,pmVar3 + (ulong)(uVar9 * uVar16) + 1,__n);
          __src = local_68;
          uVar9 = local_38->ncols;
          *(undefined8 *)(__dest + -8) = 0x3cbcf7;
          memcpy(pmVar3 + (ulong)(uVar9 * uVar16) + 1,__src,(ulong)uVar9 << 3);
          uVar9 = local_50[iVar15];
          local_50[iVar15] = local_50[uVar10];
          local_50[uVar10] = uVar9;
          local_3c = -local_3c;
          uVar9 = local_38->ncols;
          pmVar14 = local_38;
        }
        mVar1 = pmVar3[(ulong)((uVar9 + 1) * uVar16) + 1];
        if (ABS((double)mVar1) < 1e-08) {
          local_48->singular = 1;
        }
        if ((((uVar10 < uVar9) && (uVar6 = (ulong)pmVar14->nrows, uVar10 < uVar6)) &&
            (((double)mVar1 != 0.0 || (NAN((double)mVar1))))) && (local_78 < uVar6)) {
          uVar16 = uVar16 + uVar9 * (int)local_80;
          do {
            pmVar3[(ulong)uVar16 + 1] =
                 (matd_t)((double)pmVar3[(ulong)uVar16 + 1] * (1.0 / (double)mVar1));
            uVar16 = uVar16 + uVar9;
            uVar6 = uVar6 - 1;
          } while (local_80 != uVar6);
        }
        local_80 = local_80 + 1;
        uVar10 = local_78;
      } while (local_78 < a->ncols);
    }
  }
  local_48->lu = pmVar14;
  local_48->piv = local_50;
  local_48->pivsign = local_3c;
  return local_48;
}

Assistant:

matd_plu_t *matd_plu(const matd_t *a)
{
    unsigned int *piv = calloc(a->nrows, sizeof(unsigned int));
    int pivsign = 1;
    matd_t *lu = matd_copy(a);

    // only for square matrices.
    assert(a->nrows == a->ncols);

    matd_plu_t *mlu = calloc(1, sizeof(matd_plu_t));

    for (int i = 0; i < a->nrows; i++)
        piv[i] = i;

    for (int j = 0; j < a->ncols; j++) {
        for (int i = 0; i < a->nrows; i++) {
            int kmax = i < j ? i : j; // min(i,j)

            // compute dot product of row i with column j (up through element kmax)
            double acc = 0;
            for (int k = 0; k < kmax; k++)
                acc += MATD_EL(lu, i, k) * MATD_EL(lu, k, j);

            MATD_EL(lu, i, j) -= acc;
        }

        // find pivot and exchange if necessary.
        int p = j;
        if (1) {
            for (int i = j+1; i < lu->nrows; i++) {
                if (fabs(MATD_EL(lu,i,j)) > fabs(MATD_EL(lu, p, j))) {
                    p = i;
                }
            }
        }

        // swap rows p and j?
        if (p != j) {
            TYPE tmp[lu->ncols];
            memcpy(tmp, &MATD_EL(lu, p, 0), sizeof(TYPE) * lu->ncols);
            memcpy(&MATD_EL(lu, p, 0), &MATD_EL(lu, j, 0), sizeof(TYPE) * lu->ncols);
            memcpy(&MATD_EL(lu, j, 0), tmp, sizeof(TYPE) * lu->ncols);
            int k = piv[p];
            piv[p] = piv[j];
            piv[j] = k;
            pivsign = -pivsign;
        }

        double LUjj = MATD_EL(lu, j, j);

        // If our pivot is very small (which means the matrix is
        // singular or nearly singular), replace with a new pivot of the
        // right sign.
        if (fabs(LUjj) < MATD_EPS) {
/*
            if (LUjj < 0)
                LUjj = -MATD_EPS;
            else
                LUjj = MATD_EPS;

            MATD_EL(lu, j, j) = LUjj;
*/
            mlu->singular = 1;
        }

        if (j < lu->ncols && j < lu->nrows && LUjj != 0) {
            LUjj = 1.0 / LUjj;
            for (int i = j+1; i < lu->nrows; i++)
                MATD_EL(lu, i, j) *= LUjj;
        }
    }

    mlu->lu = lu;
    mlu->piv = piv;
    mlu->pivsign = pivsign;

    return mlu;
}